

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void * merge(void *a,void *b,_func_int_varargs *cmp,size_t offset)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  
  if (b != (void *)0x0) {
    iVar1 = (*cmp)(a);
    if (iVar1 < 1) {
      pvVar3 = *(void **)((long)a + offset);
      pvVar2 = a;
    }
    else {
      pvVar2 = b;
      pvVar3 = a;
      a = b;
      b = *(void **)((long)b + offset);
    }
    while ((pvVar3 != (void *)0x0 && (b != (void *)0x0))) {
      iVar1 = (*cmp)(pvVar3,b);
      if (iVar1 < 1) {
        *(void **)((long)pvVar2 + offset) = pvVar3;
        pvVar2 = pvVar3;
        pvVar3 = *(void **)((long)pvVar3 + offset);
      }
      else {
        *(void **)((long)pvVar2 + offset) = b;
        pvVar2 = b;
        b = *(void **)((long)b + offset);
      }
    }
    if (pvVar3 != (void *)0x0) {
      b = pvVar3;
    }
    *(void **)((long)pvVar2 + offset) = b;
  }
  return a;
}

Assistant:

static void *merge(void *a,void *b,int (*cmp)(),size_t offset)
{
  char *ptr, *head;

  if( a==0 ){
    head = b;
  }else if( b==0 ){
    head = a;
  }else{
    if( (*cmp)(a,b)<=0 ){
      ptr = a;
      a = NEXT(a);
    }else{
      ptr = b;
      b = NEXT(b);
    }
    head = ptr;
    while( a && b ){
      if( (*cmp)(a,b)<=0 ){
        NEXT(ptr) = a;
        ptr = a;
        a = NEXT(a);
      }else{
        NEXT(ptr) = b;
        ptr = b;
        b = NEXT(b);
      }
    }
    if( a ) NEXT(ptr) = a;
    else    NEXT(ptr) = b;
  }
  return head;
}